

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O2

void __thiscall csv::internals::IBasicCSVParser::end_feed(IBasicCSVParser *this)

{
  ParseFlags PVar1;
  element_type *peVar2;
  size_t sVar3;
  bool bVar4;
  
  peVar2 = (this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar2 == (element_type *)0x0) ||
      ((peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0)) || (sVar3 = (peVar2->data)._M_len, sVar3 == 0)) {
    bVar4 = false;
  }
  else {
    PVar1 = (this->_parse_flags)._M_elems[(long)(peVar2->data)._M_str[sVar3 - 1] + 0x80];
    bVar4 = PVar1 == QUOTE || PVar1 == DELIMITER;
  }
  if ((bVar4) || (this->field_length != 0)) {
    push_field(this);
  }
  if ((this->current_row).row_length != 0) {
    push_row(this);
    return;
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::end_feed() {
            using internals::ParseFlags;

            bool empty_last_field = this->data_ptr
                && this->data_ptr->_data
                && !this->data_ptr->data.empty()
                && (parse_flag(this->data_ptr->data.back()) == ParseFlags::DELIMITER
                    || parse_flag(this->data_ptr->data.back()) == ParseFlags::QUOTE);

            // Push field
            if (this->field_length > 0 || empty_last_field) {
                this->push_field();
            }

            // Push row
            if (this->current_row.size() > 0)
                this->push_row();
        }